

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

bool __thiscall sf::priv::WindowImpl::popEvent(WindowImpl *this,Event *event,bool block)

{
  bool bVar1;
  Time TVar2;
  reference pvVar3;
  bool block_local;
  Event *event_local;
  WindowImpl *this_local;
  
  bVar1 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::empty
                    (&this->m_events);
  if (bVar1) {
    processJoystickEvents(this);
    processSensorEvents(this);
    (*this->_vptr_WindowImpl[0x10])();
    if (block) {
      while (bVar1 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::
                     empty(&this->m_events), bVar1) {
        TVar2 = milliseconds(10);
        sleep((uint)TVar2.m_microseconds);
        processJoystickEvents(this);
        processSensorEvents(this);
        (*this->_vptr_WindowImpl[0x10])();
      }
    }
  }
  bVar1 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::empty
                    (&this->m_events);
  if (!bVar1) {
    pvVar3 = std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::front
                       (&this->m_events);
    *(undefined8 *)event = *(undefined8 *)pvVar3;
    *(undefined8 *)((long)&event->field_1 + 4) = *(undefined8 *)((long)&pvVar3->field_1 + 4);
    (event->field_1).mouseWheelScroll.y = (pvVar3->field_1).mouseWheelScroll.y;
    std::queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_>::pop(&this->m_events);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool WindowImpl::popEvent(Event& event, bool block)
{
    // If the event queue is empty, let's first check if new events are available from the OS
    if (m_events.empty())
    {
        // Get events from the system
        processJoystickEvents();
        processSensorEvents();
        processEvents();

        // In blocking mode, we must process events until one is triggered
        if (block)
        {
            // Here we use a manual wait loop instead of the optimized
            // wait-event provided by the OS, so that we don't skip joystick
            // events (which require polling)
            while (m_events.empty())
            {
                sleep(milliseconds(10));
                processJoystickEvents();
                processSensorEvents();
                processEvents();
            }
        }
    }

    // Pop the first event of the queue, if it is not empty
    if (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop();

        return true;
    }

    return false;
}